

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# perfetto.cc
# Opt level: O2

void __thiscall
perfetto::TracingServiceImpl::ProducerEndpointImpl::ClearIncrementalState
          (ProducerEndpointImpl *this,
          vector<unsigned_long,_std::allocator<unsigned_long>_> *data_sources)

{
  TaskRunner *pTVar1;
  __shared_count<(__gnu_cxx::_Lock_policy)2> _Var2;
  undefined8 *puVar3;
  __shared_ptr<perfetto::TracingServiceImpl::ProducerEndpointImpl_*,_(__gnu_cxx::_Lock_policy)2>
  local_78;
  vector<unsigned_long,_std::allocator<unsigned_long>_> local_68;
  _Any_data local_48;
  code *local_38;
  code *pcStack_30;
  WeakPtr<perfetto::TracingServiceImpl::ProducerEndpointImpl> weak_this;
  
  std::
  __shared_ptr<perfetto::TracingServiceImpl::ProducerEndpointImpl_*,_(__gnu_cxx::_Lock_policy)2>::
  __shared_ptr((__shared_ptr<perfetto::TracingServiceImpl::ProducerEndpointImpl_*,_(__gnu_cxx::_Lock_policy)2>
                *)&weak_this,
               (__shared_ptr<perfetto::TracingServiceImpl::ProducerEndpointImpl_*,_(__gnu_cxx::_Lock_policy)2>
                *)&this->weak_ptr_factory_);
  pTVar1 = this->task_runner_;
  std::
  __shared_ptr<perfetto::TracingServiceImpl::ProducerEndpointImpl_*,_(__gnu_cxx::_Lock_policy)2>::
  __shared_ptr(&local_78,
               (__shared_ptr<perfetto::TracingServiceImpl::ProducerEndpointImpl_*,_(__gnu_cxx::_Lock_policy)2>
                *)&weak_this);
  std::vector<unsigned_long,_std::allocator<unsigned_long>_>::vector(&local_68,data_sources);
  local_38 = (code *)0x0;
  pcStack_30 = (code *)0x0;
  local_48._M_unused._M_object = (void *)0x0;
  local_48._8_8_ = 0;
  puVar3 = (undefined8 *)operator_new(0x28);
  _Var2._M_pi = local_78._M_refcount._M_pi;
  local_78._M_refcount._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
  *puVar3 = local_78._M_ptr;
  puVar3[1] = _Var2._M_pi;
  local_78._M_ptr = (element_type *)0x0;
  std::vector<unsigned_long,_std::allocator<unsigned_long>_>::vector
            ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)(puVar3 + 2),&local_68);
  pcStack_30 = std::
               _Function_handler<void_(),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/kokkos[P]kokkos-tools/profiling/perfetto-connector/perfetto/perfetto.cc:60118:26)>
               ::_M_invoke;
  local_38 = std::
             _Function_handler<void_(),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/kokkos[P]kokkos-tools/profiling/perfetto-connector/perfetto/perfetto.cc:60118:26)>
             ::_M_manager;
  local_48._M_unused._M_object = puVar3;
  (*pTVar1->_vptr_TaskRunner[2])(pTVar1);
  ::std::_Function_base::~_Function_base((_Function_base *)&local_48);
  ClearIncrementalState(std::vector<unsigned_long,std::allocator<unsigned_long>>const&)::$_0::~__0
            ((__0 *)&local_78);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
            (&weak_this.handle_.
              super___shared_ptr<perfetto::TracingServiceImpl::ProducerEndpointImpl_*,_(__gnu_cxx::_Lock_policy)2>
              ._M_refcount);
  return;
}

Assistant:

void TracingServiceImpl::ProducerEndpointImpl::ClearIncrementalState(
    const std::vector<DataSourceInstanceID>& data_sources) {
  PERFETTO_DCHECK_THREAD(thread_checker_);
  auto weak_this = weak_ptr_factory_.GetWeakPtr();
  task_runner_->PostTask([weak_this, data_sources] {
    if (weak_this) {
      base::StringView producer_name(weak_this->name_);
      weak_this->producer_->ClearIncrementalState(data_sources.data(),
                                                  data_sources.size());
    }
  });
}